

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void * read_file(char *fn,uint *_sz)

{
  int __fd;
  __off_t _Var1;
  void *__buf;
  ulong uVar2;
  ulong __nbytes;
  uint uVar3;
  
  __fd = open(fn,0);
  if (__fd < 0) {
    return (void *)0x0;
  }
  _Var1 = lseek(__fd,0,2);
  uVar3 = (uint)_Var1;
  if ((((int)uVar3 < 0) || (_Var1 = lseek(__fd,0,0), _Var1 != 0)) ||
     (__buf = malloc((ulong)(uVar3 + 2)), __buf == (void *)0x0)) {
    close(__fd);
  }
  else {
    __nbytes = (ulong)(uVar3 & 0x7fffffff);
    uVar2 = read(__fd,__buf,__nbytes);
    close(__fd);
    if (uVar2 == __nbytes) {
      *(undefined1 *)((long)__buf + __nbytes) = 10;
      *(undefined1 *)((long)__buf + (ulong)(uVar3 + 1)) = 0;
      if (_sz == (uint *)0x0) {
        return __buf;
      }
      *_sz = uVar3;
      return __buf;
    }
    free(__buf);
  }
  return (void *)0x0;
}

Assistant:

void *read_file(const char *fn, unsigned *_sz)
{
    char *data;
    int sz;
    int fd;

    data = 0;
    fd = open(fn, O_RDONLY);
    if(fd < 0) return 0;

    sz = lseek(fd, 0, SEEK_END);
    if(sz < 0) goto oops;

    if(lseek(fd, 0, SEEK_SET) != 0) goto oops;

    data = (char*) malloc(sz + 2);
    if(data == 0) goto oops;

    if(read(fd, data, sz) != sz) goto oops;
    close(fd);
    data[sz] = '\n';
    data[sz+1] = 0;
    if(_sz) *_sz = sz;
    return data;

oops:
    close(fd);
    if(data != 0) free(data);
    return 0;
}